

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.cxx
# Opt level: O0

bool __thiscall
cmCTestStartCommand::InitialCheckout(cmCTestStartCommand *this,ostream *ofs,string *sourceDir)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  undefined1 local_218 [8];
  cmCTestVC vc;
  string local_88;
  allocator local_51;
  string local_50;
  char *local_30;
  char *initialCheckoutCommand;
  string *sourceDir_local;
  ostream *ofs_local;
  cmCTestStartCommand *this_local;
  
  pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
  initialCheckoutCommand = (char *)sourceDir;
  sourceDir_local = (string *)ofs;
  ofs_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"CTEST_CHECKOUT_COMMAND",&local_51);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_88,"CTEST_CVS_CHECKOUT",(allocator *)&vc.field_0x187);
    local_30 = cmMakefile::GetDefinition(pcVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&vc.field_0x187);
  }
  if (local_30 != (char *)0x0) {
    cmCTestVC::cmCTestVC
              ((cmCTestVC *)local_218,(this->super_cmCTestCommand).CTest,(ostream *)sourceDir_local)
    ;
    cmCTestVC::SetSourceDirectory((cmCTestVC *)local_218,(string *)initialCheckoutCommand);
    bVar2 = cmCTestVC::InitialCheckout((cmCTestVC *)local_218,local_30);
    if (!bVar2) {
      this_local._7_1_ = 0;
    }
    cmCTestVC::~cmCTestVC((cmCTestVC *)local_218);
    if (!bVar2) goto LAB_0053344c;
  }
  this_local._7_1_ = 1;
LAB_0053344c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestStartCommand::InitialCheckout(
  std::ostream& ofs, std::string const& sourceDir)
{
  // Use the user-provided command to create the source tree.
  const char* initialCheckoutCommand
    = this->Makefile->GetDefinition("CTEST_CHECKOUT_COMMAND");
  if(!initialCheckoutCommand)
    {
    initialCheckoutCommand =
      this->Makefile->GetDefinition("CTEST_CVS_CHECKOUT");
    }
  if(initialCheckoutCommand)
    {
    // Use a generic VC object to run and log the command.
    cmCTestVC vc(this->CTest, ofs);
    vc.SetSourceDirectory(sourceDir);
    if(!vc.InitialCheckout(initialCheckoutCommand))
      {
      return false;
      }
    }
  return true;
}